

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress.hpp
# Opt level: O0

string * __thiscall
gzip::decompress_abi_cxx11_(string *__return_storage_ptr__,gzip *this,char *data,size_t size)

{
  Decompressor local_28;
  Decompressor decomp;
  size_t size_local;
  char *data_local;
  string *output;
  
  decomp.max_ = (size_t)data;
  Decompressor::Decompressor(&local_28,1000000000);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Decompressor::decompress<std::__cxx11::string>
            (&local_28,__return_storage_ptr__,(char *)this,decomp.max_);
  return __return_storage_ptr__;
}

Assistant:

inline std::string decompress(const char *data, std::size_t size) {
        Decompressor decomp;
        std::string output;
        decomp.decompress(output, data, size);
        return output;
    }